

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiple_interfaces.cpp
# Opt level: O2

int main(void)

{
  i injector;
  injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,boost::ext::di::v1_3_0::concepts::any_of<interface1,interface2>,implementation,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>>
  local_1;
  
  boost::ext::di::v1_3_0::core::
  injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,boost::ext::di::v1_3_0::concepts::any_of<interface1,interface2>,implementation,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>>
  ::
  create_successful_impl__<boost::ext::di::v1_3_0::aux::integral_constant<bool,true>,multiple_interfaces,boost::ext::di::v1_3_0::no_name>
            (&local_1);
  return 0;
}

Assistant:

int main() {
  /*<<create injector with binding `implementation` to `interface1` and `interface2` using `di::any_of`>>*/
  // clang-format off
  auto injector = di::make_injector(
    di::bind<interface1, interface2>().to<implementation>()
  );
  // clang-format on

  injector.create<multiple_interfaces>();
}